

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O3

void grd_free(grd_t *grd)

{
  grd_st_t *grd_st;
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)grd->mdl->opt->nthread;
  if (uVar2 != 0) {
    uVar1 = 0;
    do {
      grd_st = grd->grd_st[uVar1];
      grd_stcheck(grd_st,0);
      free(grd_st);
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  free(grd->grd_st);
  free(grd);
  return;
}

Assistant:

void grd_free(grd_t *grd) {
	const uint32_t W = grd->mdl->opt->nthread;
#ifdef ATM_ANSI
	for (uint32_t w = 1; w < W; w++)
		xvm_free(grd->grd_st[w]->g);
#endif
	for (uint32_t w = 0; w < W; w++)
		grd_stfree(grd->grd_st[w]);
	free(grd->grd_st);
	free(grd);
}